

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

bool __thiscall ON_NurbsCurve::IsValid(ON_NurbsCurve *this,ON_TextLog *text_log)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  char *pcVar13;
  double *pdVar14;
  double *pdVar15;
  double dVar16;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ulong local_70;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  uVar2 = this->m_dim;
  if ((int)uVar2 < 1) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_005414d6;
    pcVar13 = "ON_NurbsCurve.m_dim = %d (should be > 0).\n";
  }
  else {
    uVar3 = this->m_order;
    if (1 < (int)uVar3) {
      if (this->m_cv_count < (int)uVar3) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_NurbsCurve.m_cv_count = %d (should be >= m_order=%d).\n",
                            (ulong)(uint)this->m_cv_count,(ulong)uVar3);
        }
        goto LAB_005414d6;
      }
      if ((text_log != (ON_TextLog *)0x0) &&
         (this->m_cv_stride < (int)((uVar2 + 1) - (uint)(this->m_is_rat == 0)))) {
        ON_TextLog::Print(text_log,"ON_NurbsCurve.m_cv_stride = %d (should be >= %d).\n");
      }
      if (this->m_cv == (double *)0x0) {
        if (text_log == (ON_TextLog *)0x0) goto LAB_005414d6;
        pcVar13 = "ON_NurbsCurve.m_cv is nullptr.\n";
      }
      else if (this->m_knot == (double *)0x0) {
        if (text_log == (ON_TextLog *)0x0) goto LAB_005414d6;
        pcVar13 = "ON_NurbsCurve.m_knot is nullptr.\n";
      }
      else {
        bVar6 = ON_IsValidKnotVector(this->m_order,this->m_cv_count,this->m_knot,text_log);
        if (bVar6) {
          uVar10 = 0;
          if (0 < this->m_dim) {
            uVar10 = (ulong)((this->m_dim + 1) - (uint)(this->m_is_rat == 0));
          }
          pdVar15 = this->m_cv;
          if (pdVar15 == (double *)0x0) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"cv pointer is null.\n");
            }
LAB_0054162d:
            bVar6 = ON_IsNotValid();
            if (!bVar6) {
              if (text_log == (ON_TextLog *)0x0) goto LAB_005414d6;
              pcVar13 = "ON_NurbsCurve.m_cv[] is not valid.\n";
              goto LAB_00541780;
            }
          }
          else {
            uVar2 = this->m_cv_count;
            uVar11 = (ulong)uVar2;
            if ((int)uVar2 < 2) {
              if (text_log != (ON_TextLog *)0x0) {
                pcVar13 = "cv_count = %d (must be >= 2).\n";
LAB_00541626:
                ON_TextLog::Print(text_log,pcVar13,uVar11);
              }
              goto LAB_0054162d;
            }
            if ((int)uVar10 < 1) {
              if (text_log != (ON_TextLog *)0x0) {
                pcVar13 = "cv_size = %d (must be >= 1).\n";
                uVar11 = 0;
                goto LAB_00541626;
              }
              goto LAB_0054162d;
            }
            uVar3 = this->m_cv_stride;
            if ((int)uVar3 < (int)uVar10) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,
                                  "cv_stride = %d and cv_size = %d (cv_stride must be >= cv_size).\n"
                                 );
              }
              goto LAB_0054162d;
            }
            local_70 = 0;
            do {
              uVar11 = 0;
              do {
                bVar6 = ON_IsValid(pdVar15[uVar11]);
                if (!bVar6) {
                  if (text_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(text_log,"cv[%d*cv_stride + %d] = %g is not valid.\n",
                                      pdVar15[uVar11],local_70);
                  }
                  goto LAB_0054162d;
                }
                uVar11 = uVar11 + 1;
              } while (uVar10 != uVar11);
              uVar9 = (int)local_70 + 1;
              local_70 = (ulong)uVar9;
              pdVar15 = pdVar15 + uVar3;
            } while (uVar9 != uVar2);
          }
          if (this->m_is_rat != 0) {
            uVar10 = (ulong)this->m_dim;
            iVar4 = this->m_cv_count;
            if (0 < (long)iVar4) {
              pdVar14 = this->m_cv + uVar10;
              iVar5 = this->m_order;
              pdVar15 = this->m_knot;
              uVar11 = 0;
              iVar12 = 0;
              dVar16 = 0.0;
              do {
                dVar1 = *pdVar14;
                iVar12 = iVar12 + 1;
                if (dVar1 != 0.0) {
                  iVar12 = 0;
                }
                if (NAN(dVar1)) {
                  iVar12 = 0;
                }
                if (iVar5 <= iVar12) {
                  if (text_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(text_log,
                                      "ON_NurbsCurve.m_cv has zero weights for CV[%d],...,CV[%d].\n"
                                      ,(ulong)(((int)uVar11 - iVar5) + 1));
                  }
LAB_0054185b:
                  bVar6 = false;
                  bVar7 = ON_IsNotValid();
                  uVar10 = (ulong)bVar7;
                  goto LAB_00541862;
                }
                if ((pdVar15[uVar11] == pdVar15[(long)iVar5 + (uVar11 - 2)]) &&
                   (!NAN(pdVar15[uVar11]) && !NAN(pdVar15[(long)iVar5 + (uVar11 - 2)]))) {
                  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                    if (text_log != (ON_TextLog *)0x0) {
                      ON_TextLog::Print(text_log,"ON_NurbsCurve.m_cv has zero weights for CV[%d].\n"
                                        ,uVar11 & 0xffffffff);
                    }
                    goto LAB_0054185b;
                  }
                  if ((dVar16 != 0.0) || (NAN(dVar16))) {
                    if (dVar1 * dVar16 <= 0.0) {
                      if (text_log != (ON_TextLog *)0x0) {
                        ON_TextLog::Print(text_log,
                                          "ON_NurbsCurve.m_cv has a zero denominator in the parameter interval [%g,%g].\n"
                                          ,pdVar15[uVar11 - 1]);
                      }
                      goto LAB_0054185b;
                    }
                  }
                  else {
                    dVar16 = *(double *)(&DAT_006a8460 + (ulong)(0.0 < dVar1) * 8);
                  }
                }
                uVar11 = uVar11 + 1;
                pdVar14 = pdVar14 + this->m_cv_stride;
              } while ((long)iVar4 != uVar11);
            }
            bVar6 = true;
            if (((iVar4 == 2) && (this->m_dim < 4)) && (this->m_order == 2)) {
              ON_Curve::PointAtStart(&local_48,&this->super_ON_Curve);
              ON_Curve::PointAtEnd(&local_60,&this->super_ON_Curve);
              bVar6 = ON_3dPoint::operator==(&local_48,&local_60);
              bVar7 = bVar6;
              if (bVar6) {
                if (text_log != (ON_TextLog *)0x0) {
                  ON_TextLog::Print(text_log,"ON_NurbsCurve is a line with no length.\n");
                }
                bVar7 = ON_IsNotValid();
              }
              uVar10 = (ulong)bVar7;
              bVar6 = !bVar6;
            }
LAB_00541862:
            bVar8 = (byte)uVar10;
            if (!bVar6) goto LAB_00541869;
          }
          bVar8 = 1;
LAB_00541869:
          return (bool)(bVar8 & 1);
        }
        if (text_log == (ON_TextLog *)0x0) goto LAB_005414d6;
        pcVar13 = "ON_NurbsCurve.m_knot[] is not a valid knot vector.\n";
      }
LAB_00541780:
      ON_TextLog::Print(text_log,pcVar13);
      goto LAB_005414d6;
    }
    if (text_log == (ON_TextLog *)0x0) goto LAB_005414d6;
    pcVar13 = "ON_NurbsCurve.m_order = %d (should be >= 2).\n";
    uVar2 = uVar3;
  }
  ON_TextLog::Print(text_log,pcVar13,(ulong)uVar2);
LAB_005414d6:
  bVar6 = ON_IsNotValid();
  return bVar6;
}

Assistant:

bool ON_NurbsCurve::IsValid( ON_TextLog* text_log ) const
{
  if ( m_dim <= 0 )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_dim = %d (should be > 0).\n",m_dim);
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_order < 2 )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_order = %d (should be >= 2).\n",m_order);
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_cv_count < m_order )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv_count = %d (should be >= m_order=%d).\n",m_cv_count,m_order);
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_cv_stride < CVSize() )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv_stride = %d (should be >= %d).\n",m_cv_stride,CVSize());
    }
  }
  
  if (m_cv == nullptr)
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv is nullptr.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_knot == nullptr)
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_knot is nullptr.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }

  if ( !ON_IsValidKnotVector( m_order, m_cv_count, m_knot, text_log ) ) 
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_knot[] is not a valid knot vector.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }

  if ( !ON_ControlPointsAreValid(CVSize(),m_cv_count,m_cv_stride,m_cv,text_log) )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv[] is not valid.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }

  if ( m_is_rat )
  {
    // weights at fully multiple knots must be nonzero
    // partial test for weight function being zero
    double sign = 0.0;
    const double* w = &m_cv[m_dim];
    int zcount = 0;
    int i;
    for ( i = 0; i < m_cv_count; i++, w += m_cv_stride )
    {
      if ( *w == 0.0 )
        zcount++;
      else
        zcount = 0;

      if ( zcount >= m_order )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsCurve.m_cv has zero weights for CV[%d],...,CV[%d].\n",i-m_order+1,i);
        }
        return ON_NurbsCurveIsNotValid(); // denominator is zero for entire span
      }
      
      if ( m_knot[i] == m_knot[i+m_order-2] ) 
      {
        if ( *w == 0.0 )
        {
          if ( text_log )
          {
            text_log->Print("ON_NurbsCurve.m_cv has zero weights for CV[%d].\n",i);
          }
          return ON_NurbsCurveIsNotValid();
        }
        
        if (sign == 0.0) 
        {
          sign = (*w > 0.0) ? 1.0 : -1.0;
        }
        else if ( *w * sign <= 0.0 ) 
        {
          if ( text_log )
          {
            text_log->Print("ON_NurbsCurve.m_cv has a zero denominator in the parameter interval [%g,%g].\n",
                            m_knot[i-1],m_knot[i]);
          }
          return ON_NurbsCurveIsNotValid();
        }
      }
    }

    if ( m_dim <= 3 && 2 == m_order && 2 == m_cv_count )
    {
      // fix for RR 21239
      // 16 November 2010 Chuck and Dale Lear added m_dim <= 3
      // so the 3d checking does not interfere with applications
      // that use high dimension curves where the start and end
      // points can be arbitrary.
      ON_3dPoint P0 = PointAtStart();
      ON_3dPoint P1 = PointAtEnd();
      if ( P0 == P1 )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsCurve is a line with no length.\n");
        }
        return ON_NurbsCurveIsNotValid();
      }
    }
  }

  return true;
}